

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zPrintPerf(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage,double rpg,double rcond,
               double *ferr,double *berr,char *equed,SuperLUStat_t *stat)

{
  double *pdVar1;
  flops_t *pfVar2;
  int *piVar3;
  int *piVar4;
  flops_t *ops;
  double *utime;
  NCformat *Ustore;
  SCformat *Lstore;
  char *equed_local;
  double *berr_local;
  double *ferr_local;
  double rcond_local;
  double rpg_local;
  mem_usage_t *mem_usage_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  
  pdVar1 = stat->utime;
  pfVar2 = stat->ops;
  if ((pdVar1[7] != 0.0) || (NAN(pdVar1[7]))) {
    printf("Factor flops = %e\tMflops = %8.2f\n",(double)pfVar2[7]);
  }
  printf("Identify relaxed snodes\t= %8.2f\n",pdVar1[2]);
  if ((pdVar1[0x11] != 0.0) || (NAN(pdVar1[0x11]))) {
    printf("Solve flops = %.0f, Mflops = %8.2f\n",(double)pfVar2[0x11],
           ((double)pfVar2[0x11] * 1e-06) / pdVar1[0x11]);
  }
  piVar3 = (int *)L->Store;
  piVar4 = (int *)U->Store;
  printf("\tNo of nonzeros in factor L = %lld\n",(long)*piVar3);
  printf("\tNo of nonzeros in factor U = %lld\n",(long)*piVar4);
  printf("\tNo of nonzeros in L+U = %lld\n",(long)*piVar3 + (long)*piVar4);
  printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage->for_lu / 1000000.0,
         (double)mem_usage->total_needed / 1000000.0);
  printf("Number of memory expansions: %d\n",(ulong)(uint)stat->expansions);
  printf("\tFactor\tMflops\tSolve\tMflops\tEtree\tEquil\tRcond\tRefine\n");
  printf("PERF:%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f\n",pdVar1[7],
         ((double)pfVar2[7] * 1e-06) / pdVar1[7],pdVar1[0x11],
         ((double)pfVar2[0x11] * 1e-06) / pdVar1[0x11],pdVar1[3],pdVar1[4],pdVar1[0x10],pdVar1[0x12]
        );
  printf("\tRpg\t\tRcond\t\tFerr\t\tBerr\t\tEquil?\n");
  printf("NUM:\t%e\t%e\t%e\t%e\t%s\n",rpg,rcond,*ferr,*berr,equed);
  return;
}

Assistant:

void
zPrintPerf(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage,
           double rpg, double rcond, double *ferr,
           const double *berr, const char *equed, SuperLUStat_t *stat)
{
    SCformat *Lstore;
    NCformat *Ustore;
    double   *utime;
    flops_t  *ops;
    
    utime = stat->utime;
    ops   = stat->ops;
    
    if ( utime[FACT] != 0. )
	printf("Factor flops = %e\tMflops = %8.2f\n", ops[FACT],
	       ops[FACT]*1e-6/utime[FACT]);
    printf("Identify relaxed snodes	= %8.2f\n", utime[RELAX]);
    if ( utime[SOLVE] != 0. )
	printf("Solve flops = %.0f, Mflops = %8.2f\n", ops[SOLVE],
	       ops[SOLVE]*1e-6/utime[SOLVE]);
    
    Lstore = (SCformat *) L->Store;
    Ustore = (NCformat *) U->Store;
    printf("\tNo of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    printf("\tNo of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    printf("\tNo of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz);
	
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	   mem_usage->for_lu/1e6, mem_usage->total_needed/1e6);
    printf("Number of memory expansions: %d\n", stat->expansions);
	
    printf("\tFactor\tMflops\tSolve\tMflops\tEtree\tEquil\tRcond\tRefine\n");
    printf("PERF:%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f\n",
	   utime[FACT], ops[FACT]*1e-6/utime[FACT],
	   utime[SOLVE], ops[SOLVE]*1e-6/utime[SOLVE],
	   utime[ETREE], utime[EQUIL], utime[RCOND], utime[REFINE]);
    
    printf("\tRpg\t\tRcond\t\tFerr\t\tBerr\t\tEquil?\n");
    printf("NUM:\t%e\t%e\t%e\t%e\t%s\n",
	   rpg, rcond, ferr[0], berr[0], equed);
    
}